

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_long>::on_dec
          (int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_long> *this)

{
  anon_class_16_2_cb75083a_for_f_conflict f;
  buffer_appender<char> bVar1;
  int num_digits;
  string_view prefix;
  undefined4 uStack_c;
  
  num_digits = (uint)*(ushort *)
                      (bsr2log10(int)::data + (ulong)((uint)LZCOUNT(this->abs_value | 1) ^ 0x3f) * 2
                      ) -
               (uint)(this->abs_value <
                     *(ulong *)(basic_data<void>::zero_or_powers_of_10_64_new +
                               (ulong)*(ushort *)
                                       (bsr2log10(int)::data +
                                       (ulong)((uint)LZCOUNT(this->abs_value | 1) ^ 0x3f) * 2) * 8))
  ;
  f._12_4_ = uStack_c;
  f.num_digits = num_digits;
  f.this = this;
  prefix.size_._0_4_ = this->prefix_size;
  prefix.data_ = this->prefix;
  prefix.size_._4_4_ = 0;
  bVar1 = write_int<fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,char,unsigned_long>::on_dec()::_lambda(fmt::v7::detail::buffer_appender<char>)_1_>
                    ((buffer_appender<char>)
                     (this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                     container,num_digits,prefix,this->specs,f);
  (this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
       (buffer<char> *)bVar1.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  return;
}

Assistant:

void on_dec() {
    auto num_digits = count_digits(abs_value);
    out = write_int(
        out, num_digits, get_prefix(), specs, [this, num_digits](iterator it) {
          return format_decimal<Char>(it, abs_value, num_digits).end;
        });
  }